

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O0

void __thiscall QToolBox::setCurrentIndex(QToolBox *this,int index)

{
  QToolBoxPrivate *this_00;
  QToolBoxButton *this_01;
  undefined4 in_ESI;
  undefined8 in_RDI;
  Page *c;
  QToolBoxPrivate *d;
  QToolBoxPrivate *in_stack_00000028;
  int _t1;
  undefined8 in_stack_ffffffffffffffe0;
  int index_00;
  undefined4 in_stack_fffffffffffffff0;
  
  _t1 = (int)((ulong)in_RDI >> 0x20);
  index_00 = (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  this_00 = d_func((QToolBox *)0x70350f);
  this_01 = (QToolBoxButton *)QToolBoxPrivate::page(this_00,index_00);
  if ((this_01 != (QToolBoxButton *)0x0) && ((QToolBoxButton *)this_00->currentPage != this_01)) {
    QToolBoxButton::setSelected(this_01,SUB41((uint)_t1 >> 0x18,0));
    if (this_00->currentPage != (Page *)0x0) {
      QWidget::hide((QWidget *)0x70357d);
      QToolBoxButton::setSelected(this_01,SUB41((uint)_t1 >> 0x18,0));
    }
    this_00->currentPage = (Page *)this_01;
    QWidget::show((QWidget *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    QToolBoxPrivate::updateTabs(in_stack_00000028);
    currentChanged((QToolBox *)0x7035d0,_t1);
  }
  return;
}

Assistant:

void QToolBox::setCurrentIndex(int index)
{
    Q_D(QToolBox);
    QToolBoxPrivate::Page *c = d->page(index);
    if (!c || d->currentPage == c)
        return;

    c->button->setSelected(true);
    if (d->currentPage) {
        d->currentPage->sv->hide();
        d->currentPage->button->setSelected(false);
    }
    d->currentPage = c;
    d->currentPage->sv->show();
    d->updateTabs();
    emit currentChanged(index);
}